

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O3

void __thiscall
Clasp::DefaultUnfoundedCheck::RemoveSource::operator()(RemoveSource *this,NodeId bId)

{
  uint32 uVar1;
  DefaultUnfoundedCheck *this_00;
  pointer pBVar2;
  BodyPtr local_10;
  
  this_00 = this->self;
  pBVar2 = (this_00->bodies_).ebo_.buf;
  uVar1 = pBVar2[bId].lower_or_ext;
  pBVar2[bId].lower_or_ext = uVar1 + 1;
  if ((uVar1 == 0) && (((ulong)pBVar2[bId] & 0x7fffffff) != 0)) {
    local_10.node = (this_00->graph_->bodies_).ebo_.buf + bId;
    local_10.id = bId;
    forwardUnsource(this_00,&local_10,this->addTodo);
    return;
  }
  return;
}

Assistant:

void operator()(NodeId bId) const {
			if (++self->bodies_[bId].lower_or_ext == 1 && self->bodies_[bId].watches != 0) {
				self->forwardUnsource(self->getBody(bId), addTodo);
			}
		}